

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void __thiscall
icu_63::CollationBuilder::makeTailoredCEs(CollationBuilder *this,UErrorCode *errorCode)

{
  CollationRootElements *this_00;
  int64_t *nodesArray;
  ulong uVar1;
  uint *puVar2;
  uint32_t *puVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  UBool UVar7;
  int32_t iVar8;
  uint32_t uVar9;
  long lVar10;
  char *pcVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  uint i;
  uint32_t t;
  ulong uVar15;
  ulong uVar16;
  uint32_t local_268;
  uint32_t local_258;
  int32_t local_254;
  CollationWeights tertiaries;
  CollationWeights secondaries;
  CollationWeights primaries;
  
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  CollationWeights::CollationWeights(&primaries);
  CollationWeights::CollationWeights(&secondaries);
  CollationWeights::CollationWeights(&tertiaries);
  nodesArray = (this->nodes).elements;
  this_00 = &this->rootElements;
  lVar10 = 0;
  do {
    if ((this->rootPrimaryIndexes).count <= lVar10) {
      return;
    }
    uVar1 = nodesArray[(this->rootPrimaryIndexes).elements[lVar10]];
    iVar12 = 0;
    uVar13 = uVar1 >> 0x20;
    uVar15 = 0x500;
    if (uVar13 == 0) {
      uVar15 = 0;
    }
    local_254 = 0;
    if (uVar13 != 0) {
      local_254 = CollationRootElements::findPrimary(this_00,(uint32_t)(uVar1 >> 0x20));
    }
    bVar5 = false;
    bVar6 = false;
    bVar4 = false;
    uVar16 = uVar15;
    i = (uint)(uVar1 >> 8) & 0xfffff;
    while( true ) {
      uVar14 = i;
      uVar9 = (uint32_t)uVar15;
      t = (uint32_t)uVar16;
      if (uVar14 == 0) break;
      uVar1 = nodesArray[uVar14];
      i = (uint)(uVar1 >> 8) & 0xfffff;
      switch((uint)uVar1 & 3) {
      case 0:
        if (!bVar5) {
          iVar8 = countTailoredNodes(nodesArray,i,0);
          UVar7 = this->baseData->compressibleBytes[uVar13 >> 0x18];
          uVar9 = CollationRootElements::getPrimaryAfter(this_00,(uint32_t)uVar13,local_254,UVar7);
          CollationWeights::initForPrimary(&primaries,UVar7);
          UVar7 = CollationWeights::allocWeights(&primaries,(uint32_t)uVar13,uVar9,iVar8 + 1);
          if (UVar7 == '\0') {
            pcVar11 = "primary tailoring gap too small";
            goto LAB_0022deea;
          }
        }
        uVar9 = CollationWeights::nextWeight(&primaries);
        uVar13 = (ulong)uVar9;
        uVar16 = 0x500;
        bVar5 = true;
        iVar12 = 0;
        bVar6 = false;
        bVar4 = false;
        uVar15 = 0x500;
        break;
      case 1:
        if ((uVar1 & 8) == 0) {
          uVar15 = uVar1 >> 0x30;
          bVar6 = false;
        }
        else {
          if (!bVar6) {
            iVar8 = countTailoredNodes(nodesArray,i,1);
            if (uVar9 == 0) {
              puVar3 = this_00->elements;
              uVar9 = (uint)*(byte *)((long)puVar3 + 0x12) * 0x100 - 0x100;
              local_268 = (uint32_t)*(ushort *)((long)puVar3 + (ulong)puVar3[1] * 4 + 2);
LAB_0022ddb8:
              if (uVar9 == 0x500) {
                uVar9 = (uint)*(byte *)((long)this_00->elements + 0x13) << 8;
              }
            }
            else {
              if (!bVar5) {
                local_268 = CollationRootElements::getSecondaryAfter(this_00,local_254,uVar9);
                goto LAB_0022ddb8;
              }
              if (uVar9 != 0x100) {
                local_268 = (uint)*(byte *)((long)this_00->elements + 0x12) << 8;
                goto LAB_0022ddb8;
              }
              uVar9 = 0x100;
              local_268 = 0x500;
            }
            CollationWeights::initForSecondary(&secondaries);
            UVar7 = CollationWeights::allocWeights(&secondaries,uVar9,local_268,iVar8 + 1);
            if (UVar7 == '\0') {
              pcVar11 = "secondary tailoring gap too small";
LAB_0022deea:
              *errorCode = U_BUFFER_OVERFLOW_ERROR;
              this->errorReason = pcVar11;
              return;
            }
          }
          uVar9 = CollationWeights::nextWeight(&secondaries);
          uVar15 = (ulong)uVar9;
          bVar6 = true;
        }
        uVar16 = 0x500;
        if ((int)uVar15 == 0) {
          uVar16 = uVar15;
        }
LAB_0022de25:
        iVar12 = 0;
        bVar4 = false;
        break;
      case 2:
        if ((uVar1 & 8) == 0) {
          uVar16 = uVar1 >> 0x30;
          goto LAB_0022de25;
        }
        if (!bVar4) {
          iVar8 = countTailoredNodes(nodesArray,i,2);
          if (t == 0) {
            puVar2 = this_00->elements;
            t = (puVar2[4] & 0xff) * 0x100 - 0x100;
            local_258 = puVar2[*puVar2] & 0x3f3f;
          }
          else if (bVar5 || bVar6) {
            if (t == 0x100) {
              local_258 = 0x500;
              t = 0x100;
            }
            else {
              local_258 = (this_00->elements[4] & 0xff) << 8;
            }
          }
          else {
            local_258 = CollationRootElements::getTertiaryAfter(this_00,local_254,uVar9,t);
          }
          CollationWeights::initForTertiary(&tertiaries);
          UVar7 = CollationWeights::allocWeights(&tertiaries,t,local_258,iVar8 + 1);
          if (UVar7 == '\0') {
            pcVar11 = "tertiary tailoring gap too small";
            goto LAB_0022deea;
          }
        }
        uVar9 = CollationWeights::nextWeight(&tertiaries);
        uVar16 = (ulong)uVar9;
        bVar4 = true;
        iVar12 = 0;
        break;
      case 3:
        if (iVar12 == 3) {
          pcVar11 = "quaternary tailoring gap too small";
          goto LAB_0022deea;
        }
        iVar12 = iVar12 + 1;
      }
      if ((uVar1 & 8) != 0) {
        nodesArray[uVar14] =
             (ulong)(iVar12 << 6 | (uint)uVar16) |
             (ulong)(uint)((int)uVar15 << 0x10) | uVar13 << 0x20;
      }
    }
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }